

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseDiscriminator(State *state)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  State *in_RDI;
  int *in_stack_00000010;
  State *in_stack_00000018;
  ParseState copy;
  ComplexityGuard guard;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffb9;
  undefined1 in_stack_ffffffffffffffba;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 uVar4;
  State *in_stack_ffffffffffffffd8;
  ComplexityGuard local_18;
  State *local_10;
  byte local_1;
  
  local_10 = in_RDI;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_18,in_RDI);
  bVar3 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_18);
  if (bVar3) {
    local_1 = 0;
  }
  else {
    iVar1 = (local_10->parse_state).mangled_idx;
    iVar2 = (local_10->parse_state).out_cur_idx;
    uVar4 = *(undefined8 *)&(local_10->parse_state).prev_name_idx;
    bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
    if (bVar3) {
      bVar3 = ParseDigit((State *)CONCAT44(in_stack_ffffffffffffffbc,
                                           CONCAT13(bVar3,CONCAT12(in_stack_ffffffffffffffba,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffffb9,
                                                  in_stack_ffffffffffffffb8)))),
                         (int *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      if (bVar3) {
        local_1 = 1;
      }
      else {
        bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38));
        if (((bVar3) && (bVar3 = ParseNumber(in_stack_00000018,in_stack_00000010), bVar3)) &&
           (bVar3 = ParseOneCharToken(in_stack_ffffffffffffffd8,(char)((ulong)uVar4 >> 0x38)), bVar3
           )) {
          local_1 = 1;
        }
        else {
          (local_10->parse_state).mangled_idx = iVar1;
          (local_10->parse_state).out_cur_idx = iVar2;
          *(undefined8 *)&(local_10->parse_state).prev_name_idx = uVar4;
          local_1 = 0;
        }
      }
    }
    else {
      local_1 = 0;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_18);
  return (bool)(local_1 & 1);
}

Assistant:

static bool ParseDiscriminator(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // Both forms start with _ so parse that first.
  if (!ParseOneCharToken(state, '_')) return false;

  // <digit>
  if (ParseDigit(state, nullptr)) return true;

  // _ <number> _
  if (ParseOneCharToken(state, '_') && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_')) {
    return true;
  }
  state->parse_state = copy;
  return false;
}